

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void * TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::ThreadWork
                 (void *voidptr)

{
  TPZDohrAssembleList<double> *this;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> data;
  TPZAutoPointer<TPZDohrAssembleItem<double>_> local_58;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> local_50;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> local_38;
  
  PopItem(&local_50,
          (TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *)voidptr);
  while ((local_50.fSubStructure.fRef != (TPZReference *)0x0 &&
         ((local_50.fSubStructure.fRef)->fPointer != (TPZDohrSubstructCondense<double> *)0x0))) {
    TPZDohrSubstructCondense<double>::Contribute_v2_local
              ((local_50.fSubStructure.fRef)->fPointer,(local_50.fInput_local.fRef)->fPointer,
               &(local_50.fv2_local.fRef)->fPointer->fAssembleData);
    this = (TPZDohrAssembleList<double> *)**(undefined8 **)((long)voidptr + 0x40);
    local_58.fRef = local_50.fv2_local.fRef;
    LOCK();
    ((local_50.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_50.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZDohrAssembleList<double>::AddItem(this,&local_58);
    TPZAutoPointer<TPZDohrAssembleItem<double>_>::~TPZAutoPointer(&local_58);
    PopItem(&local_38,
            (TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *)voidptr);
    TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::operator=
              (&local_50,&local_38);
    TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::~TPZDohrPrecondV2SubData
              (&local_38);
  }
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::~TPZDohrPrecondV2SubData
            (&local_50);
  return voidptr;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}